

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::CmdLine::set_arg(string *name,double value)

{
  double dVar1;
  Environment *pEVar2;
  String local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  ArgType local_1c;
  double dStack_18;
  ArgType type;
  double value_local;
  string *name_local;
  
  dStack_18 = value;
  value_local = (double)name;
  local_1c = get_arg_type(name);
  if ((local_1c & ~(ARG_PERCENT|ARG_STRING|ARG_DOUBLE)) != ARG_UNDEFINED) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"((type) & ~(ARG_DOUBLE | ARG_PERCENT | ARG_STRING)) == 0",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,&local_79);
    geo_assertion_failed((string *)local_40,(string *)local_78,0xb54);
  }
  pEVar2 = Environment::instance();
  dVar1 = value_local;
  String::to_string<double>(local_a0,&stack0xffffffffffffffe8);
  (*(pEVar2->super_Counted)._vptr_Counted[4])(pEVar2,dVar1,local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  return;
}

Assistant:

void set_arg(const std::string& name, double value) {
            ArgType type = get_arg_type(name);
            geo_assert_arg_type(type, ARG_DOUBLE | ARG_PERCENT | ARG_STRING);
            Environment::instance()->set_value(name, String::to_string(value));
        }